

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O3

bool __thiscall SQVM::Clone(SQVM *this,SQObjectPtr *self,SQObjectPtr *target)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQTable *pSVar3;
  SQDelegable *pSVar4;
  bool bVar5;
  int iVar6;
  SQObjectValue SVar7;
  SQArray *pSVar8;
  SQChar *pSVar9;
  SQMetaMethod mm;
  SQObjectPtr newobj;
  SQObjectPtr closure;
  SQObjectPtr temp_reg;
  SQObjectPtr local_48;
  SQObjectPtr local_38;
  SQObjectPtr local_28;
  
  local_28.super_SQObject._type = OT_NULL;
  local_28.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_48.super_SQObject._type = OT_NULL;
  local_48.super_SQObject._unVal.pTable = (SQTable *)0x0;
  SVar2 = (self->super_SQObject)._type;
  if (SVar2 == OT_ARRAY) {
    pSVar8 = SQArray::Clone((self->super_SQObject)._unVal.pArray);
    pSVar3 = (target->super_SQObject)._unVal.pTable;
    SVar2 = (target->super_SQObject)._type;
    (target->super_SQObject)._type = OT_ARRAY;
    (target->super_SQObject)._unVal.pArray = pSVar8;
    pSVar1 = &(pSVar8->super_SQCollectable).super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  else {
    if (SVar2 == OT_INSTANCE) {
      SVar7.pInstance =
           SQInstance::Clone((self->super_SQObject)._unVal.pInstance,this->_sharedstate);
      SVar2 = local_48.super_SQObject._type;
      local_48.super_SQObject._type = OT_INSTANCE;
    }
    else {
      if (SVar2 != OT_TABLE) {
        pSVar9 = GetTypeName(self);
        bVar5 = false;
        Raise_Error(this,"cloning a %s",pSVar9);
        goto LAB_0012533d;
      }
      SVar7.pTable = SQTable::Clone((self->super_SQObject)._unVal.pTable);
      SVar2 = local_48.super_SQObject._type;
      local_48.super_SQObject._type = OT_TABLE;
    }
    pSVar1 = &((SVar7.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
    if ((SVar2 >> 0x1b & 1) != 0) {
      pSVar1 = &((local_48.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        pSVar4 = &(local_48.super_SQObject._unVal.pTable)->super_SQDelegable;
        local_48.super_SQObject._unVal = SVar7;
        (*(pSVar4->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted[2])();
        SVar7 = local_48.super_SQObject._unVal;
      }
    }
    local_48.super_SQObject._unVal = SVar7;
    local_38.super_SQObject._type = OT_NULL;
    local_38.super_SQObject._unVal.pTable = (SQTable *)0x0;
    if ((((local_48.super_SQObject._unVal.pTable)->super_SQDelegable)._delegate != (SQTable *)0x0)
       && (iVar6 = (*((local_48.super_SQObject._unVal.pTable)->super_SQDelegable).
                     super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[6])
                             (local_48.super_SQObject._unVal.pTable,this,0xc,&local_38),
          (char)iVar6 != '\0')) {
      Push(this,&local_48);
      Push(this,self);
      bVar5 = CallMetaMethod(this,&local_38,mm,2,&local_28);
      if (!bVar5) {
        SQObjectPtr::~SQObjectPtr(&local_38);
        bVar5 = false;
        goto LAB_0012533d;
      }
    }
    SQObjectPtr::~SQObjectPtr(&local_38);
    SVar2 = (target->super_SQObject)._type;
    pSVar3 = (target->super_SQObject)._unVal.pTable;
    (target->super_SQObject)._unVal.pTable = (SQTable *)local_48.super_SQObject._unVal;
    (target->super_SQObject)._type = local_48.super_SQObject._type;
    if ((local_48.super_SQObject._type >> 0x1b & 1) != 0) {
      pSVar1 = &((local_48.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
  }
  bVar5 = true;
  if ((SVar2 >> 0x1b & 1) != 0) {
    bVar5 = true;
    pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      bVar5 = true;
      (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
LAB_0012533d:
  SQObjectPtr::~SQObjectPtr(&local_48);
  SQObjectPtr::~SQObjectPtr(&local_28);
  return bVar5;
}

Assistant:

bool SQVM::Clone(const SQObjectPtr &self,SQObjectPtr &target)
{
    SQObjectPtr temp_reg;
    SQObjectPtr newobj;
    switch(sq_type(self)){
    case OT_TABLE:
        newobj = _table(self)->Clone();
        goto cloned_mt;
    case OT_INSTANCE: {
        newobj = _instance(self)->Clone(_ss(this));
cloned_mt:
        SQObjectPtr closure;
        if(_delegable(newobj)->_delegate && _delegable(newobj)->GetMetaMethod(this,MT_CLONED,closure)) {
            Push(newobj);
            Push(self);
            if(!CallMetaMethod(closure,MT_CLONED,2,temp_reg))
                return false;
        }
        }
        target = newobj;
        return true;
    case OT_ARRAY:
        target = _array(self)->Clone();
        return true;
    default:
        Raise_Error(_SC("cloning a %s"), GetTypeName(self));
        return false;
    }
}